

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
TasGrid::Optimizer::getGreedyNodes<(TasGrid::TypeOneDRule)6>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,int n)

{
  iterator __position;
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong __n;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> precomputed;
  allocator_type local_51;
  vector<double,_std::allocator<double>_> local_50;
  double local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_38 = 0.0;
  uStack_30 = 0;
  uStack_2c = 0x3ff00000;
  local_28 = 0xbff0000000000000;
  uStack_20 = 0x3fe279a74590331c;
  __l._M_len = 4;
  __l._M_array = &local_38;
  ::std::vector<double,_std::allocator<double>_>::vector(&local_50,__l,&local_51);
  uVar2 = (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  __n = (ulong)n;
  if (__n <= uVar2) {
    uVar2 = __n;
  }
  ::std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)__return_storage_ptr__,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + uVar2),(allocator_type *)&local_38);
  if ((int)((ulong)((long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) < n) {
    ::std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,__n);
    iVar1 = (int)((ulong)((long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                         (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
    iVar3 = n - iVar1;
    if (iVar3 != 0 && iVar1 <= n) {
      do {
        local_38 = getNextNode<(TasGrid::TypeOneDRule)6>(__return_storage_ptr__);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,__position,
                     &local_38);
        }
        else {
          *__position._M_current = local_38;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> getGreedyNodes(int n){
    // load the first few precomputed nodes
    auto precomputed = getPrecomputed(rule);
    size_t usefirst = std::min(precomputed.size(), (size_t) n);
    std::vector<double> nodes(precomputed.begin(), precomputed.begin() + usefirst);
    if (n > (int) precomputed.size()){
        nodes.reserve((size_t) n);
        for(int i = (int) precomputed.size(); i<n; i++)
            nodes.push_back(getNextNode<rule>(nodes));
    }

    return nodes;
}